

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

ScriptFunction *
Js::GlobalObject::DefaultEvalHelper
          (ScriptContext *scriptContext,char16 *source,int sourceLength,ModuleID moduleID,
          uint32 grfscr,LPCOLESTR pszTitle,BOOL registerDocument,BOOL isIndirect,BOOL strictMode)

{
  undefined1 *puVar1;
  ThreadContext *pTVar2;
  SourceContextInfo *this;
  JavascriptLibrary *this_00;
  code *pcVar3;
  ParseableFunctionInfo *pPVar4;
  bool bVar5;
  BOOL BVar6;
  ULONG UVar7;
  uint sourceIndex;
  HRESULT HVar8;
  undefined4 *puVar9;
  utf8char_t *dest;
  size_t numBytes;
  SRCINFO *srcInfo;
  undefined4 extraout_var;
  FunctionBody *pFVar10;
  GeneratorVirtualScriptFunction *pGVar11;
  undefined8 uVar12;
  Type TVar13;
  undefined4 in_register_00000014;
  ulong requestedBytes;
  uint uVar14;
  ParseableFunctionInfo *pPVar15;
  undefined1 local_c58 [8];
  Parser parser;
  ArenaAllocator tempArena;
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  CompileScriptException se;
  AutoDynamicCodeReference dynamicFunctionReference;
  Utf8SourceInfo *local_80;
  Utf8SourceInfo *sourceInfo;
  ParseNodeProg *parseTree;
  undefined8 local_68;
  ParseableFunctionInfo *local_60;
  ParseableFunctionInfo *funcBody;
  undefined8 local_50;
  undefined4 local_48;
  Type local_44;
  undefined4 local_40;
  AutoHandledExceptionType local_3a;
  bool local_39;
  HRESULT local_38;
  AutoHandledExceptionType __autoHandledExceptionType;
  uint uStack_34;
  
  local_68 = CONCAT44(in_register_00000014,sourceLength);
  parseTree._4_4_ = moduleID;
  if (sourceLength < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x333,"(sourceLength >= 0)","sourceLength >= 0");
    if (!bVar5) goto LAB_00b59013;
    *puVar9 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x334,"(scriptContext)","scriptContext");
    if (!bVar5) goto LAB_00b59013;
    *puVar9 = 0;
  }
  bVar5 = ThreadContext::TestThreadContextFlag
                    (scriptContext->threadContext,ThreadContextFlagEvalDisabled);
  if (bVar5) {
    uVar12 = __cxa_allocate_exception(1);
    __cxa_throw(uVar12,&EvalDisabledException::typeinfo,0);
  }
  ScriptContext::ProfileBegin(scriptContext,EvalCompilePhase);
  __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
  __leaveScriptObject._36_4_ = 0;
  local_60 = (ParseableFunctionInfo *)0x0;
  LeaveScriptObject<true,_false,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_false,_false> *)
             &tempArena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              freeList,scriptContext,&stack0xfffffffffffffff8);
  pTVar2 = scriptContext->threadContext;
  local_39 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  funcBody = (ParseableFunctionInfo *)scriptContext;
  local_44 = grfscr;
  AutoHandledExceptionType::AutoHandledExceptionType
            (&local_3a,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (0x55555554 < (uint)local_68) {
    ::Math::DefaultOverflowPolicy();
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &parser.m_deferringAST,L"EvalHelperArena",
             &(scriptContext->threadContext->pageAllocator).super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  BVar6 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar5) goto LAB_00b59013;
    *puVar9 = 0;
  }
  requestedBytes = (ulong)((int)local_68 * 3 + 1);
  dest = (utf8char_t *)
         Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                   ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                    &parser.m_deferringAST,requestedBytes);
  if (dest == (utf8char_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar5) goto LAB_00b59013;
    *puVar9 = 0;
  }
  numBytes = utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                       (dest,requestedBytes,source,(charcount_t)local_68);
  if (requestedBytes < numBytes + 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x351,"(cbSource + 1 <= cbUtf8Buffer)",
                                "cbSource + 1 <= cbUtf8Buffer");
    if (!bVar5) goto LAB_00b59013;
    *puVar9 = 0;
  }
  srcInfo = ScriptContext::GetModuleSrcInfo(scriptContext,parseTree._4_4_);
  EnterPinnedScope(&local_80);
  local_80 = Utf8SourceInfo::New(scriptContext,dest,(int32)local_68,numBytes,srcInfo,
                                 (bool)((byte)(grfscr >> 0x11) & 1));
  Parser::Parser((Parser *)local_c58,scriptContext,strictMode,(PageAllocator *)0x0,false,0xaa8);
  sourceInfo = (Utf8SourceInfo *)0x0;
  this = (srcInfo->sourceContextInfo).ptr;
  local_50 = 0;
  uStack_34 = 0xffffffff;
  local_38 = 0;
  bVar5 = SourceContextInfo::IsSourceProfileLoaded(this);
  local_38 = 0;
  UVar7 = Parser::GetDeferralThreshold(bVar5);
  TVar13 = local_44;
  if (UVar7 < (uint)local_68) {
    local_38 = 0;
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,DeferParsePhase);
    TVar13 = local_44;
    if (!bVar5) {
      TVar13 = local_44 | 8;
    }
  }
  local_44 = TVar13 | 0x20;
  uVar14 = TVar13 & 0xfffffbff | 0x20;
  UVar7 = uVar14;
  if (isIndirect == 0) {
    UVar7 = local_44;
  }
  local_38 = 0;
  local_38 = Parser::ParseCesu8Source
                       ((Parser *)local_c58,(ParseNodeProg **)&sourceInfo,dest,numBytes,UVar7,
                        (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                        &this->nextLocalFunctionId,this);
  TVar13 = local_44;
  pPVar15 = funcBody;
  local_80->parseFlags = local_44;
  local_50 = 0;
  if ((local_38 < 0) || (sourceInfo == (Utf8SourceInfo *)0x0)) {
    uStack_34 = 0xffffffff;
  }
  else {
    JavascriptLibrary::BeginDynamicFunctionReferences
              ((JavascriptLibrary *)(funcBody->super_FunctionProxy).auxPtrs.ptr);
    sourceIndex = ScriptContext::SaveSourceNoCopy
                            ((ScriptContext *)pPVar15,local_80,(int)local_68,true);
    if ((strictMode == 0 && isIndirect != 0) &&
       (((ulong)(sourceInfo->debugModeSource).ptr & 0x100) == 0)) {
      TVar13 = uVar14;
    }
    HVar8 = GenerateByteCode((ParseNodeProg *)sourceInfo,TVar13,(ScriptContext *)pPVar15,&local_60,
                             sourceIndex,false,(Parser *)local_c58,
                             (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                             (ScopeInfo *)0x0,(ScriptFunction **)0x0);
    local_50 = CONCAT44(extraout_var,HVar8);
    local_80->byteCodeGenerationFlags = TVar13;
    JavascriptLibrary::EndDynamicFunctionReferences
              ((JavascriptLibrary *)(pPVar15->super_FunctionProxy).auxPtrs.ptr);
    local_44 = TVar13;
    uStack_34 = sourceIndex;
  }
  LeavePinnedScope();
  Parser::~Parser((Parser *)local_c58);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &parser.m_deferringAST);
  AutoHandledExceptionType::~AutoHandledExceptionType(&local_3a);
  pPVar15 = funcBody;
  local_48 = 0;
  local_40 = 0;
  ThreadContext::DisposeOnLeaveScript
            ((ThreadContext *)funcBody[5].super_FunctionProxy.m_utf8SourceInfo.ptr);
  pTVar2->reentrancySafeOrHandled = local_39;
  LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_false,_false> *)
             &tempArena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              freeList);
  ScriptContext::ProfileEnd((ScriptContext *)pPVar15,EvalCompilePhase);
  if ((char)local_48 != '\0') {
    JavascriptError::ThrowOutOfMemoryError((ScriptContext *)funcBody);
  }
  if ((char)local_40 == '\x01') {
    uVar12 = __cxa_allocate_exception(1);
    __cxa_throw(uVar12,&NotImplementedException::typeinfo,0);
  }
  if (local_38 < 0) {
    JavascriptError::ThrowParserError
              ((ScriptContext *)funcBody,local_38,
               (CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
  }
  if ((int)local_50 < 0) {
    if ((int)local_50 != -0x7999bffc) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x394,"(hrCodeGen == ((HRESULT)0x86664004L))",
                                  "hrCodeGen == SCRIPT_E_RECORDED");
      if (!bVar5) goto LAB_00b59013;
      *puVar9 = 0;
    }
    CompileScriptException::Free((CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
    JavascriptError::MapAndThrowError((ScriptContext *)funcBody,0);
  }
  if (local_60 == (ParseableFunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x3af,"(funcBody != nullptr)","funcBody != nullptr");
    if (!bVar5) goto LAB_00b59013;
    *puVar9 = 0;
  }
  ParseableFunctionInfo::SetDisplayName(local_60,pszTitle);
  pPVar15 = funcBody;
  puVar1 = &(local_60->super_FunctionProxy).field_0x44;
  *puVar1 = *puVar1 | 2;
  if ((local_44 >> 0x11 & 1) == 0) {
    local_c58 = (undefined1  [8])0x0;
    BVar6 = JavascriptStackWalker::GetCaller
                      ((JavascriptFunction **)local_c58,(ScriptContext *)funcBody);
    if ((local_c58 != (undefined1  [8])0x0 && BVar6 != 0) &&
       (BVar6 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)local_c58), BVar6 != 0))
    {
      pFVar10 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_c58);
      Utf8SourceInfo::SetCallerUtf8SourceInfo
                ((local_60->super_FunctionProxy).m_utf8SourceInfo.ptr,
                 (pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr);
    }
  }
  if (registerDocument != 0) {
    ParseableFunctionInfo::RegisterFuncToDiag(local_60,(ScriptContext *)pPVar15,pszTitle);
    local_60 = FunctionProxy::GetParseableFunctionInfo(&local_60->super_FunctionProxy);
    pPVar15 = funcBody;
  }
  pPVar4 = local_60;
  if ((local_60->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00b59013;
    *puVar9 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((pPVar4->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar5) {
LAB_00b59013:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  this_00 = (JavascriptLibrary *)(pPVar15->super_FunctionProxy).auxPtrs.ptr;
  if ((((pPVar4->super_FunctionProxy).functionInfo.ptr)->attributes & (Async|Generator)) == None) {
    pGVar11 = (GeneratorVirtualScriptFunction *)
              JavascriptLibrary::CreateScriptFunction(this_00,&local_60->super_FunctionProxy);
  }
  else {
    pGVar11 = JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                        (this_00,&local_60->super_FunctionProxy);
  }
  CompileScriptException::~CompileScriptException
            ((CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
  return &pGVar11->super_ScriptFunction;
}

Assistant:

ScriptFunction* GlobalObject::DefaultEvalHelper(ScriptContext* scriptContext, const char16 *source, int sourceLength, ModuleID moduleID, uint32 grfscr, LPCOLESTR pszTitle, BOOL registerDocument, BOOL isIndirect, BOOL strictMode)
    {
        Assert(sourceLength >= 0);
        AnalysisAssert(scriptContext);
        if (scriptContext->GetThreadContext()->EvalDisabled())
        {
            throw Js::EvalDisabledException();
        }

#ifdef PROFILE_EXEC
        scriptContext->ProfileBegin(Js::EvalCompilePhase);
#endif
        void * frameAddr = nullptr;
        GET_CURRENT_FRAME_ID(frameAddr);

        HRESULT hr = S_OK;
        HRESULT hrParser = S_OK;
        HRESULT hrCodeGen = S_OK;
        CompileScriptException se;
        Js::ParseableFunctionInfo * funcBody = NULL;
        uint sourceIndex = Constants::InvalidSourceIndex;
        BEGIN_LEAVE_SCRIPT_INTERNAL(scriptContext);
        BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT
        {
            uint cchSource = sourceLength;
            size_t cbUtf8Buffer = UInt32Math::MulAdd<3, 1>(cchSource);

            ArenaAllocator tempArena(_u("EvalHelperArena"), scriptContext->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory);
            LPUTF8 utf8Source = AnewArray(&tempArena, utf8char_t, cbUtf8Buffer);

            Assert(cchSource < MAXLONG);
            size_t cbSource = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Source, cbUtf8Buffer, source, static_cast<charcount_t>(cchSource));
            Assert(cbSource + 1 <= cbUtf8Buffer);

            SRCINFO const * pSrcInfo = scriptContext->GetModuleSrcInfo(moduleID);
            // Source Info objects are kept alive by the function bodies that are referencing it
            // The function body is created in GenerateByteCode but the source info isn't passed in, only the index
            // So we need to pin it here (TODO: Change GenerateByteCode to take in the sourceInfo itself)
            ENTER_PINNED_SCOPE(Utf8SourceInfo, sourceInfo);
            sourceInfo = Utf8SourceInfo::New(scriptContext, utf8Source, cchSource,
              cbSource, pSrcInfo, ((grfscr & fscrIsLibraryCode) != 0));

            Parser parser(scriptContext, strictMode);
            bool forceNoNative = false;

            ParseNodeProg * parseTree = nullptr;

            SourceContextInfo * sourceContextInfo = pSrcInfo->sourceContextInfo;
            ULONG deferParseThreshold = Parser::GetDeferralThreshold(sourceContextInfo->IsSourceProfileLoaded());
            if ((ULONG)sourceLength > deferParseThreshold && !PHASE_OFF1(Phase::DeferParsePhase))
            {
                // Defer function bodies declared inside large dynamic blocks.
                grfscr |= fscrWillDeferFncParse;
            }

            grfscr = grfscr | fscrDynamicCode;

            // fscrEval signifies direct eval in parser
            hrParser = parser.ParseCesu8Source(&parseTree, utf8Source, cbSource, isIndirect ? grfscr & ~fscrEval : grfscr, &se, &sourceContextInfo->nextLocalFunctionId,
                sourceContextInfo);
            sourceInfo->SetParseFlags(grfscr);

            if (SUCCEEDED(hrParser) && parseTree)
            {
                // This keeps function bodies generated by the byte code alive till we return
                Js::AutoDynamicCodeReference dynamicFunctionReference(scriptContext);

                Assert(cchSource < MAXLONG);
                sourceIndex = scriptContext->SaveSourceNoCopy(sourceInfo, cchSource, true);

                // Tell byte code gen not to attempt to interact with the caller's context if this is indirect eval.
                // TODO: Handle strict mode.
                if (isIndirect &&
                    !strictMode &&
                    !parseTree->GetStrictMode())
                {
                    grfscr &= ~fscrEval;
                }
                hrCodeGen = GenerateByteCode(parseTree, grfscr, scriptContext, &funcBody, sourceIndex, forceNoNative, &parser, &se);
                sourceInfo->SetByteCodeGenerationFlags(grfscr);
            }

            LEAVE_PINNED_SCOPE();
        }